

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  int iVar1;
  XmlWriter *this_00;
  uint64_t uVar2;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  LazyStat<Catch::TestCaseInfo>::operator=
            (&(this->super_StreamingReporterBase).currentTestCaseInfo,testInfo);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TestCase",&local_59);
  this_00 = XmlWriter::startElement(&this->m_xml,&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"name",&local_5a);
  XmlWriter::writeAttribute(this_00,&local_58,&testInfo->name);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  iVar1 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xc])();
  if (iVar1 == 1) {
    uVar2 = anon_unknown_23::getCurrentTicks();
    (this->m_testCaseTimer).m_ticks = uVar2;
  }
  return;
}

Assistant:

virtual void testCaseStarting( TestCaseInfo const& testInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testCaseStarting(testInfo);
            m_xml.startElement( "TestCase" ).writeAttribute( "name", testInfo.name );

            if ( m_config->showDurations() == ShowDurations::Always )
                m_testCaseTimer.start();
        }